

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Abc_Cex_t * Bmc_CexInnerStates(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t **ppCexImpl,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Abc_Cex_t *pCex_00;
  Abc_Cex_t *pCex_01;
  ulong uVar8;
  int iVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint local_5c;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x18a,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  iVar19 = 0;
  pCex_00 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  iVar9 = pCex->iFrame;
  pCex_00->iFrame = iVar9;
  pCex_00->iPo = pCex->iPo;
  pCex_01 = Abc_CexAlloc(0,p->vCis->nSize,iVar9 + 1);
  iVar9 = pCex->iFrame;
  pCex_01->iPo = pCex->iPo;
  pCex_01->iFrame = iVar9;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    do {
      iVar5 = p->vCos->nSize;
      uVar12 = (iVar5 - iVar9) + iVar19;
      if (((int)uVar12 < 0) || (iVar5 <= (int)uVar12)) goto LAB_0050ae78;
      iVar9 = p->vCos->pArray[uVar12];
      lVar10 = (long)iVar9;
      if ((lVar10 < 0) || (p->nObjs <= iVar9)) goto LAB_0050ae59;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar2 + lVar10) =
           *(ulong *)(pGVar2 + lVar10) & 0xbfffffffbfffffff | 0x4000000000000000;
      iVar19 = iVar19 + 1;
      iVar9 = p->nRegs;
    } while (iVar19 < iVar9);
  }
  local_5c = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar9 = 0;
    do {
      iVar19 = p->nRegs;
      pVVar11 = p->vCis;
      iVar5 = pVVar11->nSize;
      if (iVar19 < iVar5) {
        lVar10 = 0;
        do {
          if (iVar5 <= lVar10) goto LAB_0050ae78;
          lVar16 = (long)pVVar11->pArray[lVar10];
          if ((lVar16 < 0) || (p->nObjs <= pVVar11->pArray[lVar10])) goto LAB_0050ae59;
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar2 + lVar16) =
               *(ulong *)(pGVar2 + lVar16) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_5c + lVar10) >> 5] >>
                        ((byte)((ulong)local_5c + lVar10) & 0x1f) & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          iVar19 = p->nRegs;
          pVVar11 = p->vCis;
          iVar5 = pVVar11->nSize;
        } while (lVar10 < iVar5 - iVar19);
        local_5c = local_5c + (int)lVar10;
      }
      if (0 < iVar19) {
        iVar5 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar12 = (iVar1 - iVar19) + iVar5;
          if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_0050ae78;
          iVar1 = p->vCos->pArray[uVar12];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0050ae59;
          pGVar2 = p->pObjs;
          pVVar11 = p->vCis;
          if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_0050aadd;
          uVar12 = (pVVar11->nSize - iVar19) + iVar5;
          if (((int)uVar12 < 0) || (pVVar11->nSize <= (int)uVar12)) goto LAB_0050ae78;
          lVar10 = (long)pVVar11->pArray[uVar12];
          if ((lVar10 < 0) || ((uint)p->nObjs <= (uint)pVVar11->pArray[uVar12])) goto LAB_0050ae59;
          uVar8 = (ulong)((uint)*(ulong *)(pGVar2 + iVar1) & 0x40000000);
          uVar17 = *(ulong *)(pGVar2 + lVar10);
          *(ulong *)(pGVar2 + lVar10) = uVar17 & 0xffffffffbfffffff | uVar8;
          *(ulong *)(pGVar2 + lVar10) =
               uVar17 & 0xbfffffffbfffffff | uVar8 | *(ulong *)(pGVar2 + iVar1) & 0x4000000000000000
          ;
          iVar5 = iVar5 + 1;
          iVar19 = p->nRegs;
        } while (iVar5 < iVar19);
        pVVar11 = p->vCis;
      }
LAB_0050aadd:
      if (0 < pVVar11->nSize) {
        piVar3 = pVVar11->pArray;
        lVar10 = 0;
        do {
          iVar19 = piVar3[lVar10];
          if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_0050ae59;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar19;
          uVar17 = *(ulong *)pGVar2;
          if (((uint)uVar17 >> 0x1e & 1) != 0) {
            iVar19 = pCex_00->nPis * iVar9 + (int)lVar10;
            (&pCex_00[1].iPo)[iVar19 >> 5] =
                 (&pCex_00[1].iPo)[iVar19 >> 5] | 1 << ((byte)iVar19 & 0x1f);
            uVar17 = *(ulong *)pGVar2;
          }
          if ((uVar17 & 0x4000000000000000) != 0) {
            iVar19 = pCex_01->nPis * iVar9 + (int)lVar10;
            (&pCex_01[1].iPo)[iVar19 >> 5] =
                 (&pCex_01[1].iPo)[iVar19 >> 5] | 1 << ((byte)iVar19 & 0x1f);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar11->nSize);
      }
      if (0 < p->nObjs) {
        lVar10 = 0;
        lVar16 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar17 = *(ulong *)(&pGVar2->field_0x0 + lVar10);
          if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
            uVar12 = (int)(uVar17 & 0x1fffffff) << 2;
            uVar15 = (uint)(uVar17 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar2 + lVar10 + (ulong)uVar12 * -3) >> 0x1e;
            uVar6 = (uint)(uVar17 >> 0x1e) & 0x7ffffffc;
            uVar13 = *(uint *)((long)pGVar2 + lVar10 + (ulong)uVar6 * -3) >> 0x1e & 1;
            uVar7 = (uint)(uVar17 >> 0x3d) & 1;
            uVar18 = (uVar13 ^ uVar7) & uVar15;
            uVar8 = (ulong)(uVar18 << 0x1e);
            *(ulong *)(&pGVar2->field_0x0 + lVar10) = uVar17 & 0xffffffff3fffffff | uVar8;
            if (uVar18 == 0) {
              if (((uVar15 & 1) == 0) && (uVar13 == uVar7)) {
                uVar8 = *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar6 * -3) |
                        *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar12 * -3);
              }
              else if ((uVar15 & 1) == 0) {
                uVar8 = *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar12 * -3);
              }
              else {
                if (uVar13 != uVar7) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                                ,0x1bc,
                                "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)"
                               );
                }
                uVar8 = *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar6 * -3);
              }
              uVar17 = uVar17 & 0xbfffffff3fffffff | uVar8 & 0x4000000000000000;
            }
            else {
              uVar17 = uVar17 & 0xbfffffff3fffffff | uVar8 |
                       *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar12 * -3) & 0x4000000000000000 &
                       *(ulong *)((long)pGVar2 + lVar10 + (ulong)uVar6 * -3);
            }
            *(ulong *)(&pGVar2->field_0x0 + lVar10) = uVar17;
          }
          lVar16 = lVar16 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar16 < p->nObjs);
      }
      pVVar11 = p->vCos;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          iVar19 = pVVar11->pArray[lVar10];
          if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_0050ae59;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar19;
          uVar17 = *(ulong *)pGVar2;
          uVar8 = (ulong)((uint)uVar17 & 0x1fffffff);
          uVar14 = (ulong)(((uint)uVar17 * 2 ^ *(uint *)(pGVar2 + -uVar8)) & 0x40000000);
          *(ulong *)pGVar2 = uVar17 & 0xffffffffbfffffff | uVar14;
          *(ulong *)pGVar2 =
               uVar17 & 0xbfffffffbfffffff | uVar14 |
               *(ulong *)(pGVar2 + -uVar8) & 0x4000000000000000;
          lVar10 = lVar10 + 1;
          pVVar11 = p->vCos;
        } while (lVar10 < pVVar11->nSize);
      }
      bVar4 = iVar9 < pCex->iFrame;
      iVar9 = iVar9 + 1;
    } while (bVar4);
  }
  if (local_5c != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x1d2,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  uVar12 = pCex->iPo;
  iVar9 = p->vCos->nSize;
  if (iVar9 - p->nRegs <= (int)uVar12) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar12) && ((int)uVar12 < iVar9)) {
    iVar9 = p->vCos->pArray[uVar12];
    if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
      if ((p->pObjs[iVar9].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                      ,0x1d3,
                      "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
      }
      printf("Inner states: ");
      Bmc_CexPrint(pCex_00,p->vCis->nSize - p->nRegs,fVerbose);
      printf("Implications: ");
      Bmc_CexPrint(pCex_01,p->vCis->nSize - p->nRegs,fVerbose);
      if (ppCexImpl == (Abc_Cex_t **)0x0) {
        Abc_CexFree(pCex_01);
      }
      else {
        *ppCexImpl = pCex_01;
      }
      return pCex_00;
    }
LAB_0050ae59:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0050ae78:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Bmc_CexInnerStates( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t ** ppCexImpl, int fVerbose )
{
    Abc_Cex_t * pNew, * pNew2;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // start the counter-example
    pNew2 = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew2->iFrame = pCex->iFrame;
    pNew2->iPo    = pCex->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
    {
        pObjRi->fMark0 = 0;
        pObjRi->fMark1 = 1;
    }
    iBit = pCex->nRegs;
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
        }
        Gia_ManForEachCi( p, pObj, k )
        {
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
            if ( pObj->fMark1 )
                Abc_InfoSetBit( pNew2->pData, pNew2->nPis * i + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }

/*
        // print input/state/output
        printf( "%3d : ", i );
        Gia_ManForEachPi( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachPo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( "\n" );
*/
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );

    printf( "Inner states: " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    printf( "Implications: " );
    Bmc_CexPrint( pNew2, Gia_ManPiNum(p), fVerbose );
    if ( ppCexImpl )
        *ppCexImpl = pNew2;
    else
        Abc_CexFree( pNew2 );
    return pNew;
}